

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void VmReleaseCallContext(jx9_context *pCtx)

{
  void *pvVar1;
  void *pChunk_00;
  void *pChunk;
  jx9_aux_data *aAux;
  jx9_value **apObj;
  sxu32 n;
  jx9_context *pCtx_local;
  
  if ((pCtx->sVar).nUsed != 0) {
    pvVar1 = (pCtx->sVar).pBase;
    for (apObj._4_4_ = 0; apObj._4_4_ < (pCtx->sVar).nUsed; apObj._4_4_ = apObj._4_4_ + 1) {
      if (*(long *)((long)pvVar1 + (ulong)apObj._4_4_ * 8) != 0) {
        jx9MemObjRelease(*(jx9_value **)((long)pvVar1 + (ulong)apObj._4_4_ * 8));
        SyMemBackendPoolFree
                  (&pCtx->pVm->sAllocator,*(void **)((long)pvVar1 + (ulong)apObj._4_4_ * 8));
      }
    }
    SySetRelease(&pCtx->sVar);
  }
  if ((pCtx->sChunk).nUsed != 0) {
    pvVar1 = (pCtx->sChunk).pBase;
    for (apObj._4_4_ = 0; apObj._4_4_ < (pCtx->sChunk).nUsed; apObj._4_4_ = apObj._4_4_ + 1) {
      pChunk_00 = *(void **)((long)pvVar1 + (ulong)apObj._4_4_ * 8);
      if (pChunk_00 != (void *)0x0) {
        SyMemBackendFree(&pCtx->pVm->sAllocator,pChunk_00);
      }
    }
    SySetRelease(&pCtx->sChunk);
  }
  return;
}

Assistant:

static void VmReleaseCallContext(jx9_context *pCtx)
{
	sxu32 n;
	if( SySetUsed(&pCtx->sVar) > 0 ){
		jx9_value **apObj = (jx9_value **)SySetBasePtr(&pCtx->sVar);
		for( n = 0 ; n < SySetUsed(&pCtx->sVar) ; ++n ){
			if( apObj[n] == 0 ){
				/* Already released */
				continue;
			}
			jx9MemObjRelease(apObj[n]);
			SyMemBackendPoolFree(&pCtx->pVm->sAllocator, apObj[n]);
		}
		SySetRelease(&pCtx->sVar);
	}
	if( SySetUsed(&pCtx->sChunk) > 0 ){
		jx9_aux_data *aAux;
		void *pChunk;
		/* Automatic release of dynamically allocated chunk 
		 * using [jx9_context_alloc_chunk()].
		 */
		aAux = (jx9_aux_data *)SySetBasePtr(&pCtx->sChunk);
		for( n = 0; n < SySetUsed(&pCtx->sChunk) ; ++n ){
			pChunk = aAux[n].pAuxData;
			/* Release the chunk */
			if( pChunk ){
				SyMemBackendFree(&pCtx->pVm->sAllocator, pChunk);
			}
		}
		SySetRelease(&pCtx->sChunk);
	}
}